

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CFieldList *stm)

{
  pointer puVar1;
  __uniq_ptr_impl<CField,_std::default_delete<CField>_> _Var2;
  string *this_00;
  int index;
  ulong uVar3;
  undefined1 auStack_48 [48];
  
  this_00 = (string *)auStack_48;
  std::operator<<((ostream *)&std::cout,"typechecker: fieldlist\n");
  uVar3 = 0;
  do {
    puVar1 = (stm->fields).
             super__Vector_base<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(stm->fields).
                      super__Vector_base<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar3) {
      TypeInfo::TypeInfo((TypeInfo *)auStack_48,VOID);
      TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)auStack_48);
      this_00 = (string *)(auStack_48 + 8);
LAB_0011d91c:
      std::__cxx11::string::~string(this_00);
      return;
    }
    _Var2._M_t.super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
    super__Head_base<0UL,_CField_*,_false>._M_head_impl =
         puVar1[uVar3]._M_t.super___uniq_ptr_impl<CField,_std::default_delete<CField>_>._M_t;
    if ((_Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>)
        _Var2._M_t.super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
        super__Head_base<0UL,_CField_*,_false>._M_head_impl == (CField *)0x0) {
      CError::CError((CError *)auStack_48,&CError::AST_ERROR_abi_cxx11_,
                     &(stm->super_IWrapper).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)auStack_48);
      goto LAB_0011d91c;
    }
    (*(code *)**(undefined8 **)
                _Var2._M_t.super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
                super__Head_base<0UL,_CField_*,_false>._M_head_impl)
              (_Var2._M_t.super__Tuple_impl<0UL,_CField_*,_std::default_delete<CField>_>.
               super__Head_base<0UL,_CField_*,_false>._M_head_impl,this);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void CTypeCheckerVisitor::Visit( CFieldList &stm ) 
{
	std::cout << "typechecker: fieldlist\n";
    bool areAllFieldsBuilt = true;
    for (int index = 0; index < stm.fields.size(); ++index) {
        auto field = stm.fields[index].get();
        if( !field ) {
            areAllFieldsBuilt = false;
            break;
        }
        field->Accept( *this );
    }
    if( areAllFieldsBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}